

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O2

int resweb(sunrealtype tt,N_Vector cc,N_Vector cp,N_Vector res,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  sunrealtype tcalc;
  
  lVar2 = N_VGetArrayPointer(cp);
  lVar3 = N_VGetArrayPointer(res);
  lVar1 = *(long *)((long)user_data + 0x10);
  Fweb(tcalc,cc,res,(UserData)user_data);
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
    lVar5 = lVar2;
    lVar6 = lVar3;
    for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        if (lVar8 < lVar1) {
          *(double *)(lVar6 + lVar8 * 8) =
               *(double *)(lVar5 + lVar8 * 8) - *(double *)(lVar6 + lVar8 * 8);
        }
        else {
          *(ulong *)(lVar6 + lVar8 * 8) = *(ulong *)(lVar6 + lVar8 * 8) ^ 0x8000000000000000;
        }
      }
      lVar6 = lVar6 + 0x10;
      lVar5 = lVar5 + 0x10;
    }
    lVar3 = lVar3 + 0x140;
    lVar2 = lVar2 + 0x140;
  }
  return 0;
}

Assistant:

static int resweb(sunrealtype tt, N_Vector cc, N_Vector cp, N_Vector res,
                  void* user_data)
{
  sunindextype jx, jy, is, yloc, loc, np;
  sunrealtype *resv, *cpv;
  UserData webdata;

  webdata = (UserData)user_data;

  cpv  = N_VGetArrayPointer(cp);
  resv = N_VGetArrayPointer(res);
  np   = webdata->np;

  /* Call Fweb to set res to vector of right-hand sides. */
  Fweb(tt, cc, res, webdata);

  /* Loop over all grid points, setting residual values appropriately
     for differential or algebraic components.                        */

  for (jy = 0; jy < MY; jy++)
  {
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      loc = yloc + NUM_SPECIES * jx;
      for (is = 0; is < NUM_SPECIES; is++)
      {
        if (is < np) { resv[loc + is] = cpv[loc + is] - resv[loc + is]; }
        else { resv[loc + is] = -resv[loc + is]; }
      }
    }
  }

  return (0);
}